

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O3

ares_status_t
ares_hosts_search_host
          (ares_channel_t *channel,ares_bool_t use_env,char *host,ares_hosts_entry_t **entry)

{
  ares_status_t aVar1;
  ares_hosts_entry_t *paVar2;
  
  *entry = (ares_hosts_entry_t *)0x0;
  aVar1 = ares_hosts_update(channel,use_env);
  if (aVar1 == ARES_SUCCESS) {
    if (channel->hf == (ares_hosts_file_t *)0x0) {
      aVar1 = ARES_ENOTFOUND;
    }
    else {
      paVar2 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(channel->hf->hosthash,host);
      *entry = paVar2;
      aVar1 = (uint)(paVar2 == (ares_hosts_entry_t *)0x0) << 2;
    }
  }
  return aVar1;
}

Assistant:

ares_status_t ares_hosts_search_host(ares_channel_t *channel,
                                     ares_bool_t use_env, const char *host,
                                     const ares_hosts_entry_t **entry)
{
  ares_status_t status;

  *entry = NULL;

  status = ares_hosts_update(channel, use_env);
  if (status != ARES_SUCCESS) {
    return status;
  }

  if (channel->hf == NULL) {
    return ARES_ENOTFOUND; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  *entry = ares_htable_strvp_get_direct(channel->hf->hosthash, host);
  if (*entry == NULL) {
    return ARES_ENOTFOUND;
  }

  return ARES_SUCCESS;
}